

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBooleanObject.cpp
# Opt level: O3

void __thiscall
Js::JavascriptBooleanObject::JavascriptBooleanObject
          (JavascriptBooleanObject *this,JavascriptBoolean *value,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014f90f8;
  Memory::Recycler::WBSetBit((char *)&this->value);
  (this->value).ptr = value;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->value);
  if ((type->super_Type).typeId != TypeIds_BooleanObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBooleanObject.cpp"
                                ,0xc,"(type->GetTypeId() == TypeIds_BooleanObject)",
                                "type->GetTypeId() == TypeIds_BooleanObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

JavascriptBooleanObject::JavascriptBooleanObject(JavascriptBoolean* value, DynamicType * type)
        : DynamicObject(type), value(value)
    {
        Assert(type->GetTypeId() == TypeIds_BooleanObject);
    }